

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void absl::lts_20250127::synchronization_internal::MoveToList(Rep *r,Vec<int> *src,Vec<int> *dst)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Node *pNVar4;
  undefined8 in_RAX;
  long lVar5;
  int32_t w;
  undefined8 uStack_38;
  
  piVar3 = src->ptr_;
  uVar1 = src->size_;
  uStack_38 = in_RAX;
  for (lVar5 = 0; (ulong)uVar1 << 2 != lVar5; lVar5 = lVar5 + 4) {
    uVar2 = *(uint *)((long)piVar3 + lVar5);
    uStack_38 = CONCAT44(uVar2,(undefined4)uStack_38);
    pNVar4 = (r->nodes_).ptr_[uVar2];
    *(int32_t *)((long)piVar3 + lVar5) = pNVar4->rank;
    pNVar4->visited = false;
    anon_unknown_0::Vec<int>::push_back(dst,(int *)((long)&uStack_38 + 4));
  }
  return;
}

Assistant:

static void MoveToList(
    GraphCycles::Rep* r, Vec<int32_t>* src, Vec<int32_t>* dst) {
  for (auto& v : *src) {
    int32_t w = v;
    // Replace v entry with its rank
    v = r->nodes_[static_cast<uint32_t>(w)]->rank;
    // Prepare for future DFS calls
    r->nodes_[static_cast<uint32_t>(w)]->visited = false;
    dst->push_back(w);
  }
}